

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clothModel.h
# Opt level: O1

void __thiscall embree::collide2::ClothModel::clearCollisionConstraints(ClothModel *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  
  ppCVar1 = (this->c_constraints_).
            super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->c_constraints_).
                 super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
      ppCVar2 = ppCVar2 + 1) {
    if (*ppCVar2 != (Constraint *)0x0) {
      (*(*ppCVar2)->_vptr_Constraint[1])();
    }
  }
  ppCVar2 = (this->c_constraints_).
            super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->c_constraints_).
      super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
    (this->c_constraints_).
    super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  }
  return;
}

Assistant:

void clearCollisionConstraints()
    {
      for (auto c : c_constraints_) {
        delete c;
      }
      c_constraints_.clear ();
    }